

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O3

size_t __thiscall proto2_unittest::TestCord::ByteSizeLong(TestCord *this)

{
  int iVar1;
  anon_union_40_1_493b367e_for_TestCord_3 aVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  
  aVar2 = this->field_0;
  if (((undefined1  [40])aVar2 & (undefined1  [40])0x3) == (undefined1  [40])0x0) {
    sVar5 = 0;
  }
  else {
    if (((undefined1  [40])aVar2 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      sVar5 = 0;
    }
    else {
      uVar3 = (ulong)*(char *)((long)&this->field_0 + 8);
      if ((uVar3 & 1) == 0) {
        uVar3 = uVar3 >> 1;
      }
      else {
        uVar3 = **(ulong **)((long)&this->field_0 + 0x10);
      }
      uVar4 = (uint)uVar3 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = uVar3 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [40])aVar2 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
      uVar3 = (ulong)*(char *)((long)&this->field_0 + 0x18);
      if ((uVar3 & 1) == 0) {
        uVar3 = uVar3 >> 1;
      }
      else {
        uVar3 = **(ulong **)((long)&this->field_0 + 0x20);
      }
      uVar4 = (uint)uVar3 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + uVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}